

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>::set_paging<3>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false> *this)

{
  bool bVar1;
  Region RVar2;
  State SVar3;
  MainState MVar4;
  ZeroState ZVar5;
  State *pSVar6;
  MainState *pMVar7;
  int iVar8;
  uint8_t *local_e8;
  uint8_t *local_d8;
  uint8_t *local_d0;
  uint8_t *local_c0;
  uint8_t *local_b8;
  uint8_t *local_a8;
  uint8_t *local_a0;
  uint8_t *local_90;
  uint8_t *local_88;
  uint8_t *local_78;
  uint8_t *local_70;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_48;
  uint8_t *local_40;
  MainState state;
  uint8_t *rom;
  uint8_t *ram;
  ZeroState zero_state;
  State language_state;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false> *this_local;
  
  ZVar5 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>_>
          ::zero_state(&this->auxiliary_switches_);
  if (ZVar5) {
    this->write_pages_[0] = this->aux_ram_;
  }
  else {
    this->write_pages_[0] = this->ram_;
  }
  this->write_pages_[1] = this->write_pages_[0] + 0x100;
  this->read_pages_[0] = this->write_pages_[0];
  this->read_pages_[1] = this->write_pages_[1];
  pSVar6 = LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>_>
           ::state(&this->language_card_);
  SVar3 = *pSVar6;
  bVar1 = pSVar6->write;
  ZVar5 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>_>
          ::zero_state(&this->auxiliary_switches_);
  if (ZVar5) {
    local_40 = this->aux_ram_;
  }
  else {
    local_40 = this->ram_;
  }
  local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->rom_,0xf00);
  local_48 = local_60;
  if (((uint3)SVar3 & 0x100) != 0) {
    iVar8 = 0xc000;
    if (((uint3)SVar3 & 1) != 0) {
      iVar8 = 0xd000;
    }
    local_48 = local_40 + iVar8;
  }
  if ((bVar1 & 1U) == 0) {
    iVar8 = 0xc000;
    if (((uint3)SVar3 & 1) != 0) {
      iVar8 = 0xd000;
    }
    local_58 = local_40 + iVar8;
  }
  else {
    local_58 = (uint8_t *)0x0;
  }
  page(this,0xd0,0xe0,local_48,local_58);
  if (((uint3)SVar3 & 0x100) == 0) {
    local_60 = local_60 + 0x1000;
  }
  else {
    local_60 = local_40 + 0xe000;
  }
  if ((bVar1 & 1U) == 0) {
    local_70 = local_40 + 0xe000;
  }
  else {
    local_70 = (uint8_t *)0x0;
  }
  page(this,0xe0,0x100,local_60,local_70);
  pMVar7 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_false>_>
           ::main_state(&this->auxiliary_switches_);
  MVar4 = *pMVar7;
  RVar2 = pMVar7->region_20_40;
  if (((uint6)MVar4 & 1) == 0) {
    local_78 = this->ram_;
  }
  else {
    local_78 = this->aux_ram_;
  }
  local_78 = local_78 + 0x200;
  if (((uint6)MVar4 & 0x100) == 0) {
    local_88 = this->ram_;
  }
  else {
    local_88 = this->aux_ram_;
  }
  local_88 = local_88 + 0x200;
  page(this,2,4,local_78,local_88);
  if (((uint6)MVar4 & 1) == 0) {
    local_90 = this->ram_;
  }
  else {
    local_90 = this->aux_ram_;
  }
  local_90 = local_90 + 0x800;
  if (((uint6)MVar4 & 0x100) == 0) {
    local_a0 = this->ram_;
  }
  else {
    local_a0 = this->aux_ram_;
  }
  local_a0 = local_a0 + 0x800;
  page(this,8,0x20,local_90,local_a0);
  if (((uint6)MVar4 & 1) == 0) {
    local_a8 = this->ram_;
  }
  else {
    local_a8 = this->aux_ram_;
  }
  local_a8 = local_a8 + 0x4000;
  if (((uint6)MVar4 & 0x100) == 0) {
    local_b8 = this->ram_;
  }
  else {
    local_b8 = this->aux_ram_;
  }
  local_b8 = local_b8 + 0x4000;
  page(this,0x40,0xc0,local_a8,local_b8);
  if (((uint6)MVar4 & 0x10000) == 0) {
    local_c0 = this->ram_;
  }
  else {
    local_c0 = this->aux_ram_;
  }
  local_c0 = local_c0 + 0x400;
  if (((uint6)MVar4 & 0x1000000) == 0) {
    local_d0 = this->ram_;
  }
  else {
    local_d0 = this->aux_ram_;
  }
  local_d0 = local_d0 + 0x400;
  page(this,4,8,local_c0,local_d0);
  if (((ushort)RVar2 & 1) == 0) {
    local_d8 = this->ram_;
  }
  else {
    local_d8 = this->aux_ram_;
  }
  local_d8 = local_d8 + 0x2000;
  if (((ushort)RVar2 & 0x100) == 0) {
    local_e8 = this->ram_;
  }
  else {
    local_e8 = this->aux_ram_;
  }
  local_e8 = local_e8 + 0x2000;
  page(this,0x20,0x40,local_d8,local_e8);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}